

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O2

void __thiscall Pl_Base64::flush_decode(Pl_Base64 *this)

{
  uchar uVar1;
  uchar uVar2;
  Pipeline *pPVar3;
  unsigned_long uVar4;
  runtime_error *prVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uchar out [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->end_of_data != false) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    Pipeline::getIdentifier_abi_cxx11_((string *)out,&this->super_Pipeline);
    std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out,
                   ": base64 decode: data follows pad characters");
    std::runtime_error::runtime_error(prVar5,(string *)&local_38);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = this->buf[3];
  bVar6 = 0x12;
  local_38._M_dataplus._M_p._0_4_ = 0;
  uVar7 = 0;
  lVar8 = 0;
  do {
    if (lVar8 == 4) {
      out[0] = (uchar)(uVar7 >> 0x10);
      out[1] = (uchar)(uVar7 >> 8);
      out[2] = (uchar)uVar7;
      pPVar3 = (this->super_Pipeline).next_;
      local_38._M_dataplus._M_p._0_4_ = 3 - (int)local_38._M_dataplus._M_p;
      uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&local_38);
      (*pPVar3->_vptr_Pipeline[2])(pPVar3,out,uVar4);
      return;
    }
    uVar2 = this->buf[lVar8];
    iVar9 = (int)(char)uVar2;
    if ((byte)(uVar2 + 0xbf) < 0x1a) {
      iVar9 = iVar9 + -0x41;
    }
    else if ((byte)(uVar2 + 0x9f) < 0x1a) {
      iVar9 = iVar9 + -0x47;
    }
    else if ((byte)(uVar2 - 0x30) < 10) {
      iVar9 = iVar9 + 4;
    }
    else if ((uVar2 == '+') || (uVar2 == '-')) {
      iVar9 = 0x3e;
    }
    else if ((uVar2 == '/') || (uVar2 == '_')) {
      iVar9 = 0x3f;
    }
    else {
      if ((uVar2 != '=') || ((lVar8 != 3 && ((lVar8 != 2 || (uVar1 != '=')))))) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        Pipeline::getIdentifier_abi_cxx11_((string *)out,&this->super_Pipeline);
        std::operator+(&local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out,
                       ": base64 decode: invalid input");
        std::runtime_error::runtime_error(prVar5,(string *)&local_38);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_38._M_dataplus._M_p._0_4_ = (int)local_38._M_dataplus._M_p + 1;
      this->end_of_data = true;
      iVar9 = 0;
    }
    uVar7 = uVar7 | iVar9 << (bVar6 & 0x1f);
    bVar6 = bVar6 - 6;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void
Pl_Base64::flush_decode()
{
    if (this->end_of_data) {
        throw std::runtime_error(getIdentifier() + ": base64 decode: data follows pad characters");
    }
    int pad = 0;
    int shift = 18;
    int outval = 0;
    for (size_t i = 0; i < 4; ++i) {
        int v = 0;
        char ch = to_c(this->buf[i]);
        if ((ch >= 'A') && (ch <= 'Z')) {
            v = ch - 'A';
        } else if ((ch >= 'a') && (ch <= 'z')) {
            v = ch - 'a' + 26;
        } else if ((ch >= '0') && (ch <= '9')) {
            v = ch - '0' + 52;
        } else if ((ch == '+') || (ch == '-')) {
            v = 62;
        } else if ((ch == '/') || (ch == '_')) {
            v = 63;
        } else if ((ch == '=') && ((i == 3) || ((i == 2) && (this->buf[3] == '=')))) {
            ++pad;
            this->end_of_data = true;
            v = 0;
        } else {
            throw std::runtime_error(getIdentifier() + ": base64 decode: invalid input");
        }
        outval |= v << shift;
        shift -= 6;
    }
    unsigned char out[3] = {
        to_uc(outval >> 16),
        to_uc(0xff & (outval >> 8)),
        to_uc(0xff & outval),
    };

    next()->write(out, QIntC::to_size(3 - pad));
}